

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void output_stored_text(void)

{
  FILE *__stream;
  FILE *__stream_00;
  int iVar1;
  int __c;
  uint uVar2;
  char cVar3;
  char cVar4;
  
  fclose((FILE *)text_file);
  text_file = (FILE *)fopen(text_file_name,"r");
  if ((FILE *)text_file == (FILE *)0x0) {
    open_error(text_file_name);
  }
  __stream = text_file;
  __c = getc((FILE *)text_file);
  __stream_00 = code_file;
  if (__c != -1) {
    cVar4 = '\x01';
    do {
      if (__c == 10) {
        cVar3 = '\x01';
        iVar1 = outline + 1;
        if (cVar4 != '\x02') goto LAB_0010f923;
        uVar2 = outline + 2;
        outline = outline + 1;
        fprintf((FILE *)__stream_00,line_format + 1,(ulong)uVar2,code_file_name);
        cVar3 = '\x01';
      }
      else {
        cVar3 = (__c == 0x23 && cVar4 == '\x01') * '\x02';
        iVar1 = outline;
LAB_0010f923:
        outline = iVar1;
        putc(__c,(FILE *)__stream_00);
      }
      __c = getc((FILE *)__stream);
      cVar4 = cVar3;
    } while (__c != -1);
    if (lflag == '\0') {
      uVar2 = outline + 2;
      outline = outline + 1;
      fprintf((FILE *)__stream_00,line_format,(ulong)uVar2,code_file_name);
      return;
    }
  }
  return;
}

Assistant:

void output_stored_text()
{
    register int c;
    register FILE *in, *out;
    register int state;	/* 0=middle of line, 1=start of line, 2=seen '#' */

    state = 1;
    fclose(text_file);
    text_file = fopen(text_file_name, "r");
    if (text_file == NULL)
	open_error(text_file_name);
    in = text_file;
    if ((c = getc(in)) == EOF)
	return;
    out = code_file;
    do {
	if (c == '\n') {
	    ++outline;
	    if (state == 2) {
		fprintf(out, line_format+1, outline + 1, code_file_name);
		state = 1;
		continue; }
	    state = 1; }
	else if (state == 1 && c == '#')
	    state = 2;
	else
	    state = 0;
	putc(c, out);
    } while ((c = getc(in)) != EOF);
    if (!lflag)
	fprintf(out, line_format, ++outline + 1, code_file_name);
}